

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

TestNode * __thiscall xe::TestNode::find(TestNode *this,char *path)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  TestNode *pTVar5;
  Error *this_00;
  int compLen;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this->m_nodeType == TESTNODETYPE_ROOT) {
LAB_0011788d:
    pTVar5 = TestGroup::findChildNode((TestGroup *)this,path);
    return pTVar5;
  }
  uVar7 = 0;
  while( true ) {
    iVar6 = (int)uVar7;
    if ((path[iVar6] == '\0') || (path[iVar6] == '.')) break;
    uVar7 = (ulong)(iVar6 + 1);
  }
  if (iVar6 < 1) {
    this_00 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(this_00,(char *)0x0,"compLen > 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                 ,0x9d);
    __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  if (*pcVar2 == *path) {
    uVar8 = 0;
    do {
      if (uVar7 - 1 == uVar8) goto LAB_00117868;
      lVar3 = uVar8 + 1;
      uVar1 = uVar8 + 1;
      lVar4 = uVar8 + 1;
      uVar8 = uVar1;
    } while (pcVar2[lVar3] == path[lVar4]);
    if (uVar7 <= uVar1) {
LAB_00117868:
      if (pcVar2[iVar6] == '\0') {
        if (path[iVar6] == '\0') {
          return this;
        }
        if (this->m_nodeType == TESTNODETYPE_GROUP) {
          path = path + (long)iVar6 + 1;
          goto LAB_0011788d;
        }
      }
    }
  }
  return (TestNode *)0x0;
}

Assistant:

const TestNode* TestNode::find (const char* path) const
{
	if (m_nodeType == TESTNODETYPE_ROOT)
	{
		// Don't need to consider current node.
		return static_cast<const TestGroup*>(this)->findChildNode(path);
	}
	else
	{
		// Check if first component matches this node.
		int compLen = getFirstComponentLength(path);
		XE_CHECK(compLen > 0);

		if (compareNameToPathComponent(getName(), path, compLen))
		{
			if (path[compLen] == 0)
				return this;
			else if (getNodeType() == TESTNODETYPE_GROUP)
				return static_cast<const TestGroup*>(this)->findChildNode(path + compLen + 1);
			else
				return DE_NULL;
		}
		else
			return DE_NULL;
	}
}